

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcc.c
# Opt level: O0

int qcc_main(int argc,char **argv,qcc_main_fn main_fn)

{
  void *buffer;
  undefined1 local_f8 [8];
  qcc_engine eng;
  qcc_arena arena;
  char *arena_data;
  size_t arena_size;
  qcc_main_fn main_fn_local;
  char **argv_local;
  int argc_local;
  
  buffer = malloc(0x400000);
  qcc_arena_init((qcc_arena *)&eng.logger.messages.last,buffer,0x400000);
  qcc_engine_init((qcc_engine *)local_f8,(qcc_arena *)&eng.logger.messages.last);
  (*main_fn)((qcc_engine *)local_f8);
  qcc_logger_dump((qcc_logger *)&eng.total_tests,"%s\n");
  printf("Summary: %u total tests run, %u tests failed\n",(ulong)eng.max_tries,
         (ulong)eng.required_successes);
  qcc_arena_done((qcc_arena *)&eng.logger.messages.last);
  free(buffer);
  return eng.required_successes;
}

Assistant:

int qcc_main(int argc, const char *argv[], qcc_main_fn main_fn)
{
    (void)argc;
    (void)argv;

    const size_t arena_size = 4 * 1024 * 1024;
    char *arena_data = (char *)malloc(arena_size);

    struct qcc_arena arena;
    qcc_arena_init(&arena, arena_data, arena_size);

    struct qcc_engine eng;
    qcc_engine_init(&eng, &arena);

    main_fn(&eng);

    qcc_logger_dump(&eng.logger, "%s\n");
    printf("Summary: %u total tests run, %u tests failed\n", eng.total_tests,
           eng.failed_tests);

    qcc_arena_done(&arena);
    free(arena_data);

    return eng.failed_tests;
}